

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_ortho(vec4 *M,float l,float r,float b,float t,float n,float f)

{
  float f_local;
  float n_local;
  float t_local;
  float b_local;
  float r_local;
  float l_local;
  vec4 *M_local;
  
  (*M)[0] = 2.0 / (r - l);
  (*M)[3] = 0.0;
  (*M)[2] = 0.0;
  (*M)[1] = 0.0;
  M[1][1] = 2.0 / (t - b);
  M[1][3] = 0.0;
  M[1][2] = 0.0;
  M[1][0] = 0.0;
  M[2][2] = -2.0 / (f - n);
  M[2][3] = 0.0;
  M[2][1] = 0.0;
  M[2][0] = 0.0;
  M[3][0] = -(r + l) / (r - l);
  M[3][1] = -(t + b) / (t - b);
  M[3][2] = -(f + n) / (f - n);
  M[3][3] = 1.0;
  return;
}

Assistant:

LINMATH_H_FUNC void mat4x4_ortho(mat4x4 M, float l, float r, float b, float t, float n, float f)
{
	M[0][0] = 2.f/(r-l);
	M[0][1] = M[0][2] = M[0][3] = 0.f;

	M[1][1] = 2.f/(t-b);
	M[1][0] = M[1][2] = M[1][3] = 0.f;

	M[2][2] = -2.f/(f-n);
	M[2][0] = M[2][1] = M[2][3] = 0.f;
	
	M[3][0] = -(r+l)/(r-l);
	M[3][1] = -(t+b)/(t-b);
	M[3][2] = -(f+n)/(f-n);
	M[3][3] = 1.f;
}